

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::cmLocalNinjaGenerator
          (cmLocalNinjaGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf)

{
  cmState *this_00;
  string *psVar1;
  allocator<char> local_4d [13];
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmGlobalGenerator *gg_local;
  cmLocalNinjaGenerator *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)gg;
  gg_local = (cmGlobalGenerator *)this;
  this_00 = cmMakefile::GetState(mf);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)&local_40,(string *)psVar1);
  cmLocalCommonGenerator::cmLocalCommonGenerator
            (&this->super_cmLocalCommonGenerator,gg,mf,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalNinjaGenerator_009663a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->HomeRelativeOutputPath,"",local_4d);
  std::allocator<char>::~allocator(local_4d);
  std::
  map<const_cmCustomCommand_*,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>,_std::less<const_cmCustomCommand_*>,_std::allocator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>_>
  ::map(&this->CustomCommandTargets);
  std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::vector
            (&this->CustomCommands);
  return;
}

Assistant:

cmLocalNinjaGenerator::cmLocalNinjaGenerator(cmGlobalGenerator* gg,
                                             cmMakefile* mf)
  : cmLocalCommonGenerator(gg, mf, mf->GetState()->GetBinaryDirectory())
  , HomeRelativeOutputPath("")
{
}